

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall
soul::heart::Parser::parseReadStream
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder,AssignmentTarget *target)

{
  Module *pMVar1;
  pointer ppVar2;
  pointer pcVar3;
  size_type sVar4;
  FunctionBuilder *this_00;
  bool bVar5;
  Identifier *in_R9;
  IODeclaration *this_01;
  pointer ppVar6;
  bool bVar7;
  string_view other;
  string_view other_00;
  Identifier name;
  CodeLocation local_a0;
  FunctionParseState *local_90;
  FunctionParseState *local_88;
  FunctionBuilder *local_80;
  undefined1 local_78 [16];
  CompileMessage local_68;
  
  local_78._8_8_ = parseGeneralIdentifier(this);
  pMVar1 = (this->module).object;
  if (pMVar1 == (Module *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  local_90 = state;
  local_88 = (FunctionParseState *)target;
  local_80 = builder;
  if ((string *)local_78._8_8_ == (string *)0x0) {
    throwInternalCompilerError("isValid()","operator basic_string_view",0x22);
  }
  ppVar6 = (pMVar1->inputs).
           super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (pMVar1->inputs).
           super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = ppVar6 == ppVar2;
  if (!bVar7) {
    pcVar3 = (((string *)local_78._8_8_)->_M_dataplus)._M_p;
    sVar4 = ((string *)local_78._8_8_)->_M_string_length;
    other._M_str = pcVar3;
    other._M_len = sVar4;
    bVar5 = Identifier::operator==(&(ppVar6->object->super_IODeclaration).name,other);
    while (!bVar5) {
      ppVar6 = ppVar6 + 1;
      bVar7 = ppVar6 == ppVar2;
      if (bVar7) goto LAB_00257d20;
      other_00._M_str = pcVar3;
      other_00._M_len = sVar4;
      bVar5 = Identifier::operator==(&(ppVar6->object->super_IODeclaration).name,other_00);
    }
    if (!bVar7) {
      this_01 = &ppVar6->object->super_IODeclaration;
      goto LAB_00257d28;
    }
  }
LAB_00257d20:
  this_01 = (IODeclaration *)0x0;
LAB_00257d28:
  this_00 = local_80;
  if (this_01 == (IODeclaration *)0x0) {
    CompileMessageHelpers::createMessage<soul::Identifier&>
              ((CompileMessage *)(local_78 + 0x10),(CompileMessageHelpers *)0x1,none,0x2ada07,
               local_78 + 8,in_R9);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,local_78 + 0x10);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
      operator_delete(local_68.description._M_dataplus._M_p,
                      (ulong)(local_68.description.field_2._M_allocated_capacity + 1));
    }
  }
  local_a0.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_a0.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_a0.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_a0.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_a0.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  if (this_01 != (IODeclaration *)0x0) {
    IODeclaration::getSingleDataType((Type *)(local_78 + 0x10),this_01);
    AssignmentTarget::create
              ((AssignmentTarget *)local_78,local_88,(FunctionBuilder *)local_90,(Type *)this_00);
    if ((Expression *)local_78._0_8_ != (Expression *)0x0) {
      BlockBuilder::addReadStream
                (&this_00->super_BlockBuilder,&local_a0,(Expression *)local_78._0_8_,
                 (InputDeclaration *)this_01);
      RefCountedPtr<soul::Structure>::decIfNotNull
                ((Structure *)local_68.description.field_2._M_allocated_capacity);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.sourceCode.object);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x2881d4);
      return;
    }
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void parseReadStream (FunctionParseState& state, FunctionBuilder& builder, const AssignmentTarget& target)
    {
        auto name = parseGeneralIdentifier();
        auto src = module->findInput (name);

        if (src == nullptr)
            throwError (Errors::cannotFindInput (name));

        builder.addReadStream (location, *target.create (state, builder, src->getSingleDataType()), *src);
        expectSemicolon();
    }